

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall SearcherThreaded::Start(SearcherThreaded *this,Position *pos)

{
  mutex *__mutex;
  pointer pMVar1;
  thread tStack_38;
  SearcherThreaded *local_30;
  type local_28 [2];
  
  (*(this->super_SearcherReporting).super_SearcherBase._vptr_SearcherBase[1])();
  SearcherBase::Start((SearcherBase *)this,pos);
  __mutex = &(this->super_SearcherReporting).super_SearcherBase.m_Lock;
  std::mutex::lock(__mutex);
  if (((this->super_SearcherReporting).super_SearcherBase.m_bTerminated._M_base._M_i & 1U) != 0) {
    pMVar1 = (this->super_SearcherReporting).super_SearcherBase.m_Result.m_Moves.
             super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((this->super_SearcherReporting).super_SearcherBase.m_Result.m_Moves.
        super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish !=
        pMVar1) {
      (this->super_SearcherReporting).super_SearcherBase.m_Result.m_Moves.
      super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
           pMVar1;
    }
    LOCK();
    (this->super_SearcherReporting).super_SearcherBase.m_bTerminated._M_base._M_i = false;
    UNLOCK();
    (this->super_SearcherReporting).super_SearcherBase.m_Director.m_SearchStopTime = 0;
    (this->super_SearcherReporting).super_SearcherBase.m_Director.m_SearchEmergencyStopTime = 0;
    local_28[0] = 0x21;
    local_28[1] = 0;
    local_30 = this;
    std::thread::thread<int(SearcherThreaded::*)(),SearcherThreaded*,void>
              (&tStack_38,local_28,&local_30);
    std::thread::operator=(&(this->super_SearcherReporting).super_SearcherBase.m_Thread,&tStack_38);
    std::thread::~thread(&tStack_38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

virtual void Start( const Position &pos )
    {
        Stop();

        super::Start( pos );

        SearchLockType guard( m_Lock );

        if ( m_bTerminated == false )
            return;

        m_Result.Clear();
        m_bTerminated = false;
        m_Director.Action();
        m_Thread = thread( &SearcherThreaded::Search, this );
    }